

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_pool16c_r6_insn(DisasContext_conflict6 *ctx)

{
  _Bool _Var1;
  int rd;
  int rt_00;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  int offset_1;
  int swm_converted;
  int enc_rs;
  int enc_rt;
  int enc_dest;
  int imm;
  int offset;
  int lwm_converted;
  int rs;
  int rt;
  DisasContext_conflict6 *ctx_local;
  
  rd = mmreg(ctx->opcode >> 7 & 7);
  rt_00 = mmreg(ctx->opcode >> 4 & 7);
  switch(ctx->opcode & 0xf) {
  case 0:
    gen_logic(ctx,0x27,rd,rt_00,0);
    break;
  case 1:
    gen_logic(ctx,0x24,rd,rd,rt_00);
    break;
  case 2:
    uVar4 = extract32(ctx->opcode,8,2);
    uVar2 = extract32(ctx->opcode,4,4);
    gen_ldst_multiple(ctx,5,uVar4 + 0x11,0x1d,(int16_t)(uVar2 << 2));
    break;
  case 3:
    if ((ctx->opcode >> 4 & 1) == 0) {
      uVar4 = extract32(ctx->opcode,5,5);
      gen_compute_branch(ctx,8,2,uVar4,0,0,0);
    }
    else {
      uVar4 = extract32(ctx->opcode,5,5);
      gen_compute_branch(ctx,8,2,0x1f,0,0,0);
      gen_arith_imm(ctx,0x24000000,0x1d,0x1d,uVar4 << 2);
    }
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    gen_movep(ctx,ctx->opcode >> 7 & 7,ctx->opcode >> 4 & 7,ctx->opcode & 3 | ctx->opcode >> 1 & 4);
    break;
  case 8:
    gen_logic(ctx,0x26,rd,rd,rt_00);
    break;
  case 9:
    gen_logic(ctx,0x25,rd,rd,rt_00);
    break;
  case 10:
    uVar4 = extract32(ctx->opcode,8,2);
    uVar2 = extract32(ctx->opcode,4,4);
    gen_ldst_multiple(ctx,0xd,uVar4 + 0x11,0x1d,(int16_t)(uVar2 << 2));
    break;
  case 0xb:
    uVar3 = ctx->opcode & 0x3f;
    if (uVar3 != 0xb) {
      if (uVar3 == 0x1b) {
        generate_exception(ctx,0x12);
        return;
      }
      if (uVar3 != 0x2b) {
        if (uVar3 != 0x3b) {
          return;
        }
        uVar4 = extract32(ctx->opcode,6,4);
        _Var1 = is_uhi(uVar4);
        if (_Var1) {
          return;
        }
        if ((ctx->hflags & 0x400000) != 0) {
          generate_exception(ctx,0x14);
          return;
        }
        generate_exception(ctx,0x10);
        return;
      }
    }
    gen_compute_branch(ctx,9,2,ctx->opcode >> 5 & 0x1f,0x1f,0,0);
    break;
  default:
    generate_exception(ctx,0x14);
  }
  return;
}

Assistant:

static void gen_pool16c_r6_insn(DisasContext *ctx)
{
    int rt = mmreg((ctx->opcode >> 7) & 0x7);
    int rs = mmreg((ctx->opcode >> 4) & 0x7);

    switch (ctx->opcode & 0xf) {
    case R6_NOT16:
        gen_logic(ctx, OPC_NOR, rt, rs, 0);
        break;
    case R6_AND16:
        gen_logic(ctx, OPC_AND, rt, rt, rs);
        break;
    case R6_LWM16:
        {
            int lwm_converted = 0x11 + extract32(ctx->opcode, 8, 2);
            int offset = extract32(ctx->opcode, 4, 4);
            gen_ldst_multiple(ctx, LWM32, lwm_converted, 29, offset << 2);
        }
        break;
    case R6_JRC16: /* JRCADDIUSP */
        if ((ctx->opcode >> 4) & 1) {
            /* JRCADDIUSP */
            int imm = extract32(ctx->opcode, 5, 5);
            gen_compute_branch(ctx, OPC_JR, 2, 31, 0, 0, 0);
            gen_arith_imm(ctx, OPC_ADDIU, 29, 29, imm << 2);
        } else {
            /* JRC16 */
            rs = extract32(ctx->opcode, 5, 5);
            gen_compute_branch(ctx, OPC_JR, 2, rs, 0, 0, 0);
        }
        break;
    case MOVEP:
    case MOVEP_05:
    case MOVEP_06:
    case MOVEP_07:
    case MOVEP_0C:
    case MOVEP_0D:
    case MOVEP_0E:
    case MOVEP_0F:
        {
            int enc_dest = uMIPS_RD(ctx->opcode);
            int enc_rt = uMIPS_RS2(ctx->opcode);
            int enc_rs = (ctx->opcode & 3) | ((ctx->opcode >> 1) & 4);
            gen_movep(ctx, enc_dest, enc_rt, enc_rs);
        }
        break;
    case R6_XOR16:
        gen_logic(ctx, OPC_XOR, rt, rt, rs);
        break;
    case R6_OR16:
        gen_logic(ctx, OPC_OR, rt, rt, rs);
        break;
    case R6_SWM16:
        {
            int swm_converted = 0x11 + extract32(ctx->opcode, 8, 2);
            int offset = extract32(ctx->opcode, 4, 4);
            gen_ldst_multiple(ctx, SWM32, swm_converted, 29, offset << 2);
        }
        break;
    case JALRC16: /* BREAK16, SDBBP16 */
        switch (ctx->opcode & 0x3f) {
        case JALRC16:
        case JALRC16 + 0x20:
            /* JALRC16 */
            gen_compute_branch(ctx, OPC_JALR, 2, (ctx->opcode >> 5) & 0x1f,
                               31, 0, 0);
            break;
        case R6_BREAK16:
            /* BREAK16 */
            generate_exception(ctx, EXCP_BREAK);
            break;
        case R6_SDBBP16:
            /* SDBBP16 */
            if (is_uhi(extract32(ctx->opcode, 6, 4))) {
                // gen_helper_do_semihosting(tcg_ctx, tcg_ctx->cpu_env);
            } else {
                if (ctx->hflags & MIPS_HFLAG_SBRI) {
                    generate_exception(ctx, EXCP_RI);
                } else {
                    generate_exception(ctx, EXCP_DBp);
                }
            }
            break;
        }
        break;
    default:
        generate_exception(ctx, EXCP_RI);
        break;
    }
}